

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.c
# Opt level: O3

ZyanStatus
ZydisFormatterFormatOperand
          (ZydisFormatter *formatter,ZydisDecodedInstruction *instruction,
          ZydisDecodedOperand *operand,char *buffer,ZyanUSize length,ZyanU64 runtime_address,
          void *user_data)

{
  ZyanStatus ZVar1;
  int iVar2;
  undefined1 auVar3 [16];
  ZydisFormatterBuffer formatter_buffer;
  ZydisFormatterContext local_80;
  ZydisFormatterBuffer local_58;
  
  auVar3._0_4_ = -(uint)(formatter == (ZydisFormatter *)0x0);
  auVar3._4_4_ = -(uint)(instruction == (ZydisDecodedInstruction *)0x0);
  auVar3._8_4_ = -(uint)(operand == (ZydisDecodedOperand *)0x0);
  auVar3._12_4_ = -(uint)(buffer == (char *)0x0);
  iVar2 = movmskps((int)formatter,auVar3);
  ZVar1 = 0x80100004;
  if (iVar2 == 0 && length != 0) {
    local_58.is_token_list = '\0';
    local_58.capacity = 0;
    local_58.string.flags = '\x01';
    local_58.string.vector.allocator = (ZyanAllocator *)0x0;
    local_58.string.vector.growth_factor = '\x01';
    local_58.string.vector.shrink_threshold = '\0';
    local_58.string.vector.destructor = (ZyanMemberProcedure)0x0;
    local_58.string.vector.element_size = 1;
    local_58.string.vector.size = 1;
    *buffer = '\0';
    local_80.operands = (ZydisDecodedOperand *)0x0;
    local_80.user_data = user_data;
    local_80.instruction = instruction;
    local_80.operand = operand;
    local_80.runtime_address = runtime_address;
    local_58.string.vector.capacity = length;
    local_58.string.vector.data = buffer;
    if ((formatter->func_pre_operand == (ZydisFormatterFunc)0x0) ||
       (ZVar1 = (*formatter->func_pre_operand)(formatter,&local_58,&local_80), -1 < (int)ZVar1)) {
      switch((local_80.operand)->type) {
      case ZYDIS_OPERAND_TYPE_REGISTER:
        ZVar1 = (*formatter->func_format_operand_reg)(formatter,&local_58,&local_80);
        break;
      case ZYDIS_OPERAND_TYPE_MEMORY:
        ZVar1 = (*formatter->func_format_operand_mem)(formatter,&local_58,&local_80);
        break;
      case ZYDIS_OPERAND_TYPE_POINTER:
        ZVar1 = (*formatter->func_format_operand_ptr)(formatter,&local_58,&local_80);
        break;
      case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZVar1 = (*formatter->func_format_operand_imm)(formatter,&local_58,&local_80);
        break;
      default:
        return 0x80100004;
      }
      if ((-1 < (int)ZVar1) &&
         ((formatter->func_post_operand == (ZydisFormatterFunc)0x0 ||
          (ZVar1 = (*formatter->func_post_operand)(formatter,&local_58,&local_80), -1 < (int)ZVar1))
         )) {
        ZVar1 = 0x100000;
      }
    }
  }
  return ZVar1;
}

Assistant:

ZyanStatus ZydisFormatterFormatOperand(const ZydisFormatter* formatter,
    const ZydisDecodedInstruction* instruction, const ZydisDecodedOperand* operand,
    char* buffer, ZyanUSize length, ZyanU64 runtime_address, void* user_data)
{
    if (!formatter || !instruction || !operand || !buffer || (length == 0))
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZydisFormatterBuffer formatter_buffer;
    ZydisFormatterBufferInit(&formatter_buffer, buffer, length);

    ZydisFormatterContext context;
    context.instruction     = instruction;
    context.operands        = ZYAN_NULL;
    context.runtime_address = runtime_address;
    context.operand         = operand;
    context.user_data       = user_data;

    // We ignore `ZYDIS_STATUS_SKIP_TOKEN` for all operand-functions as it does not make any sense
    // to skip the only operand printed by this function

    if (formatter->func_pre_operand)
    {
        ZYAN_CHECK(formatter->func_pre_operand(formatter, &formatter_buffer, &context));
    }

    switch (context.operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
        ZYAN_CHECK(formatter->func_format_operand_reg(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_MEMORY:
        ZYAN_CHECK(formatter->func_format_operand_mem(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        ZYAN_CHECK(formatter->func_format_operand_imm(formatter, &formatter_buffer, &context));
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_CHECK(formatter->func_format_operand_ptr(formatter, &formatter_buffer, &context));
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    if (formatter->func_post_operand)
    {
        ZYAN_CHECK(formatter->func_post_operand(formatter, &formatter_buffer, &context));
    }

    return ZYAN_STATUS_SUCCESS;
}